

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPController.cpp
# Opt level: O1

void __thiscall cppti::HTTPController::routeTalks(HTTPController *this,Request *req,Response *res)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  TalksDB *this_00;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,__1L> filtertags;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__nptr;
  size_t sVar3;
  size_t sVar4;
  Response *pRVar5;
  const_iterator cVar6;
  char *pcVar7;
  ostream *poVar8;
  int *piVar9;
  undefined8 uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  reference_wrapper<const_cppti::TalksDB::TalkRef> *prVar12;
  int64_t year;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long lVar14;
  Params *this_01;
  char *pcVar15;
  _Base_ptr p_Var16;
  string_view speaker_00;
  string_view conference_00;
  string rawyear;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  tags;
  string speaker;
  json json;
  string raw_tags;
  string conference;
  key_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  ulong local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_118;
  char *local_f8;
  size_t local_f0;
  char local_e8;
  undefined7 uStack_e7;
  HTTPController *local_d8;
  undefined1 local_d0 [8];
  json_value local_c8;
  reference_wrapper<const_cppti::TalksDB::TalkRef> *local_c0;
  long local_b8;
  reference_wrapper<const_cppti::TalksDB::TalkRef> local_b0 [2];
  char *local_a0;
  size_t local_98;
  char local_90;
  undefined7 uStack_8f;
  vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
  local_80;
  Params *local_68;
  _Base_ptr local_60;
  Response *local_58;
  __normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>
  local_50;
  extent_type<_1L> local_48;
  pointer peStack_40;
  char *local_38;
  
  this_01 = &req->params;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_d8 = this;
  local_58 = res;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"speaker","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_01->_M_t,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  p_Var16 = &(req->params)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_f8 = &local_e8;
  if (cVar6._M_node == p_Var16) {
    local_f0 = 0;
    local_e8 = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,*(long *)(cVar6._M_node + 2),
               (long)&(cVar6._M_node[2]._M_parent)->_M_color + *(long *)(cVar6._M_node + 2));
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"conference","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_01->_M_t,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_a0 = &local_90;
  if (cVar6._M_node == p_Var16) {
    local_98 = 0;
    local_90 = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,*(long *)(cVar6._M_node + 2),
               (long)&(cVar6._M_node[2]._M_parent)->_M_color + *(long *)(cVar6._M_node + 2));
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"tags","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_01->_M_t,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_c0 = local_b0;
  if (cVar6._M_node == p_Var16) {
    local_b8 = 0;
    local_b0[0]._M_data._0_1_ = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,*(long *)(cVar6._M_node + 2),
               (long)&(cVar6._M_node[2]._M_parent)->_M_color + *(long *)(cVar6._M_node + 2));
  }
  prVar12 = local_c0;
  if (local_b8 == 0) {
    local_118.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pcVar15 = (char *)((long)&local_c0->_M_data + local_b8);
    local_118.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158._M_dataplus._M_p._0_1_ = 0x2c;
    pcVar7 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (local_c0,pcVar15);
    local_68 = this_01;
    local_60 = p_Var16;
    if (pcVar7 != pcVar15) {
      do {
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar7 + -(long)prVar12);
        local_158._M_dataplus._M_p = (pointer)prVar12;
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::emplace_back<char_const*,long>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&local_118,(char **)&local_158,(long *)&local_138);
        prVar12 = (reference_wrapper<const_cppti::TalksDB::TalkRef> *)(pcVar7 + 1);
        local_158._M_dataplus._M_p._0_1_ = 0x2c;
        pcVar7 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (prVar12,pcVar15,&local_158);
      } while (pcVar7 != pcVar15);
    }
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pcVar7 + -(long)prVar12);
    local_158._M_dataplus._M_p = (pointer)prVar12;
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<char_const*,long>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&local_118,(char **)&local_158,(long *)&local_138);
    this_01 = local_68;
    p_Var16 = local_60;
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"year","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_01->_M_t,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_138 = &local_128;
  if (cVar6._M_node == p_Var16) {
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,*(long *)(cVar6._M_node + 2),
               (long)&(cVar6._M_node[2]._M_parent)->_M_color + *(long *)(cVar6._M_node + 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"speaker=\'",9);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_f8,local_f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', conference=\'",0xf);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_a0,local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', tags=\'",9);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_c0,local_b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', year=",8);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_138->_M_local_buf,local_130);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  __nptr = local_138;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_138->_M_local_buf + local_130);
  paVar11 = local_138;
  if (0 < (long)local_130 >> 2) {
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)local_138 + (local_130 & 0xfffffffffffffffc));
    lVar14 = ((long)local_130 >> 2) + 1;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)local_138 + 3);
    do {
      if ((int)*(char *)((long)(&paVar13->_M_allocated_capacity + -1) + 5) - 0x3aU < 0xfffffff6) {
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)(&paVar13->_M_allocated_capacity + -1) + 5);
        goto LAB_00134b54;
      }
      if ((int)*(char *)((long)(&paVar13->_M_allocated_capacity + -1) + 6) - 0x3aU < 0xfffffff6) {
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)(&paVar13->_M_allocated_capacity + -1) + 6);
        goto LAB_00134b54;
      }
      if ((int)*(char *)((long)(&paVar13->_M_allocated_capacity + -1) + 7) - 0x3aU < 0xfffffff6) {
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)(&paVar13->_M_allocated_capacity + -1) + 7);
        goto LAB_00134b54;
      }
      if ((int)paVar13->_M_local_buf[0] - 0x3aU < 0xfffffff6) goto LAB_00134b54;
      lVar14 = lVar14 + -1;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar13 + 4);
    } while (1 < lVar14);
  }
  lVar14 = (long)paVar1 - (long)paVar11;
  if (lVar14 == 1) {
LAB_00134b33:
    paVar13 = paVar11;
    if (0xfffffff5 < (int)paVar11->_M_local_buf[0] - 0x3aU) {
      paVar13 = paVar1;
    }
  }
  else if (lVar14 == 2) {
LAB_00134b25:
    paVar13 = paVar11;
    if (0xfffffff5 < (int)paVar11->_M_local_buf[0] - 0x3aU) {
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar11 + 1);
      goto LAB_00134b33;
    }
  }
  else {
    paVar13 = paVar1;
    if ((lVar14 == 3) && (paVar13 = paVar11, 0xfffffff5 < (int)paVar11->_M_local_buf[0] - 0x3aU)) {
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar11 + 1);
      goto LAB_00134b25;
    }
  }
LAB_00134b54:
  if (paVar13 == paVar1) {
    if (local_130 == 0) {
      year = 0;
    }
    else {
      piVar9 = __errno_location();
      iVar2 = *piVar9;
      *piVar9 = 0;
      lVar14 = strtol(__nptr->_M_local_buf,(char **)&local_158,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_00134dfc:
        uVar10 = std::__throw_out_of_range("stoi");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.
               super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_80.
                          super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.
                                super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.
                                super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,
                          CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0])
                          + 1);
        }
        if (local_118.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_118.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_c0 != local_b0) {
          operator_delete(local_c0,CONCAT71(local_b0[0]._M_data._1_7_,local_b0[0]._M_data._0_1_) + 1
                         );
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
        }
        _Unwind_Resume(uVar10);
      }
      if (((int)lVar14 != lVar14) || (*piVar9 == 0x22)) goto LAB_00134dfc;
      if (*piVar9 == 0) {
        *piVar9 = iVar2;
      }
      year = (int64_t)(int)lVar14;
    }
    sVar4 = local_98;
    pcVar15 = local_a0;
    sVar3 = local_f0;
    pcVar7 = local_f8;
    this_00 = (local_d8->talksdb)._M_data;
    gsl::span<std::basic_string_view<char,std::char_traits<char>>const,-1l>::
    span<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,void>
              ((span<std::basic_string_view<char,std::char_traits<char>>const,_1l> *)&local_48,
               &local_118);
    filtertags.storage_.data_ = peStack_40;
    filtertags.storage_.super_extent_type<_1L>.size_ = local_48.size_;
    speaker_00._M_str = pcVar7;
    speaker_00._M_len = sVar3;
    conference_00._M_str = pcVar15;
    conference_00._M_len = sVar4;
    TalksDB::get(&local_80,this_00,speaker_00,conference_00,filtertags,year,0x32);
    local_c8.object = (object_t *)0x0;
    local_d0[0] = array;
    local_158._M_dataplus._M_p =
         (pointer)local_80.
                  super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_50._M_current =
         local_80.
         super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_c8.object =
         (object_t *)
         nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::
         create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,__gnu_cxx::__normal_iterator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>const*,std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>>,__gnu_cxx::__normal_iterator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>const*,std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>>>
                   ((__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>
                     *)&local_158,&local_50);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_d0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_d0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(&local_158,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_d0,-1,' ',false,strict);
    pRVar5 = local_58;
    std::__cxx11::string::_M_assign((string *)&local_58->body);
    local_50._M_current = (reference_wrapper<const_cppti::TalksDB::TalkRef> *)0x165bfb;
    local_38 = "application/json";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&pRVar5->headers,(char **)&local_50,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_d0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_d0 + 8),local_d0[0]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.
           super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_80.
                      super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,
                    CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) + 1);
  }
  if (local_118.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,CONCAT71(local_b0[0]._M_data._1_7_,local_b0[0]._M_data._0_1_) + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  return;
}

Assistant:

void HTTPController::routeTalks(Request const& req, Response& res)
{
  auto const speaker = req.get_param_value("speaker");
  auto const conference = req.get_param_value("conference");
  auto const raw_tags = req.get_param_value("tags");
  auto const tags = splitTags(raw_tags);
  auto const rawyear = req.get_param_value("year");
  std::cout << "speaker='" << speaker << "', conference='" << conference
            << "', tags='" << raw_tags << "', year=" << rawyear << std::endl;
  if (!std::all_of(rawyear.begin(), rawyear.end(), [&](char c) {
        return std::isdigit(c);
      }))
    return;
  auto const year = rawyear.empty() ? 0 : std::stoi(rawyear);
  auto const& talks = this->talksdb.get().get(speaker, conference, tags, year);

  nlohmann::json const json = talks;
  res.set_content(json.dump(), "application/json");
}